

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist_tests.cpp
# Opt level: O3

void __thiscall
skiplist_tests::findearliestatleast_test::test_method(findearliestatleast_test *this)

{
  undefined8 *puVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  void *__s;
  void *__s_00;
  long lVar5;
  long lVar6;
  int64_t iVar7;
  uint64_t uVar8;
  CBlockIndex *pCVar9;
  CBlockIndex *pCVar10;
  void *pvVar11;
  int iVar12;
  ulong uVar13;
  iterator in_R8;
  iterator pvVar14;
  iterator in_R9;
  iterator pvVar15;
  uint i;
  ulong uVar16;
  char *pcVar17;
  long lVar18;
  FastRandomContext *this_00;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  CChain chain;
  check_type cVar19;
  int local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  assertion_result local_e0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  char *local_88;
  char *local_80;
  undefined1 local_78 [20];
  uint32_t uStack_64;
  uint32_t auStack_60 [2];
  undefined1 local_58 [24];
  char **ppcStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __s = operator_new(3200000);
  memset(__s,0,3200000);
  __s_00 = operator_new(15200000);
  uVar16 = 0;
  memset(__s_00,0,15200000);
  this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng;
  do {
    uVar4 = (uint32_t)uVar16;
    uStack_64 = 0;
    auStack_60[0] = 0;
    auStack_60[1] = 0;
    local_78._4_4_ = 0;
    local_78._8_4_ = 0;
    local_78._12_4_ = 0;
    local_78._16_4_ = 0;
    local_78._0_4_ = uVar4;
    ArithToUint256((uint256 *)local_58,(arith_uint256 *)local_78);
    lVar5 = uVar16 * 0x20;
    puVar1 = (undefined8 *)((long)__s + lVar5 + 0x10);
    *puVar1 = local_58._16_8_;
    puVar1[1] = ppcStack_40;
    *(undefined8 *)((long)__s + lVar5) = local_58._0_8_;
    ((undefined8 *)((long)__s + lVar5))[1] = CONCAT71(local_58._9_7_,local_58[8]);
    lVar6 = uVar16 * 0x98;
    pCVar9 = (CBlockIndex *)((long)__s_00 + lVar6);
    *(uint32_t *)((long)__s_00 + lVar6 + 0x18) = uVar4;
    lVar18 = (ulong)(uVar4 - 1) * 0x98;
    pvVar11 = (void *)((long)__s_00 + lVar18);
    if (uVar16 == 0) {
      pvVar11 = (void *)0x0;
    }
    *(void **)((long)__s_00 + lVar6 + 8) = pvVar11;
    *(void **)((long)__s_00 + lVar6) = (void *)((long)__s + lVar5);
    CBlockIndex::BuildSkip(pCVar9);
    if (uVar16 < 10) {
      pCVar9->nTime = uVar4;
    }
    else {
      iVar7 = CBlockIndex::GetMedianTimePast(pCVar9);
      uVar13 = iVar7 - 1;
      if (uVar13 == 0) {
        uVar3 = 0x40;
      }
      else {
        lVar5 = 0x3f;
        if (uVar13 != 0) {
          for (; uVar13 >> lVar5 == 0; lVar5 = lVar5 + -1) {
          }
        }
        uVar3 = (uint)lVar5 ^ 0x3f;
      }
      do {
        uVar8 = RandomMixin<FastRandomContext>::randbits
                          (&this_00->super_RandomMixin<FastRandomContext>,0x40 - uVar3);
      } while (uVar13 < uVar8);
      local_168 = (int)iVar7;
      uVar4 = (int)uVar8 + local_168;
      pCVar9->nTime = uVar4;
      uVar3 = *(uint *)((long)__s_00 + lVar18 + 0x90);
      if (uVar4 < uVar3) {
        uVar4 = uVar3;
      }
    }
    pCVar9->nTimeMax = uVar4;
    uVar16 = uVar16 + 1;
  } while (uVar16 != 100000);
  pcVar17 = (char *)0x90;
  uVar3 = 0;
  do {
    uVar2 = *(uint *)((long)__s_00 + (long)(pcVar17 + -0x10));
    if (*(uint *)((long)__s_00 + (long)(pcVar17 + -0x10)) < uVar3) {
      uVar2 = uVar3;
    }
    uVar3 = uVar2;
    local_88 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_80 = "";
    local_98 = &boost::unit_test::basic_cstring<char_const>::null;
    local_90 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x7f;
    file.m_begin = (iterator)&local_88;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_98,msg);
    local_78[0] = uVar3 == *(uint *)((long)__s_00 + (long)pcVar17);
    local_78._8_4_ = 0;
    local_78._12_4_ = 0;
    local_78._16_4_ = 0;
    uStack_64 = 0;
    local_e0._0_8_ = "curTimeMax == vBlocksMain[i].nTimeMax";
    local_e0.m_message.px = (element_type *)0xf4522c;
    local_58[8] = false;
    local_58._0_8_ = &PTR__lazy_ostream_013ae1c8;
    local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
    ppcStack_40 = (char **)&local_e0;
    local_a8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_a0 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_78,(lazy_ostream *)local_58,1,0,WARN,_cVar19,
               (size_t)&local_a8,0x7f);
    boost::detail::shared_count::~shared_count((shared_count *)(local_78 + 0x10));
    pcVar17 = pcVar17 + 0x98;
  } while (pcVar17 !=
           "051e38255b82493de27ffd3efbe1b179b9642d2166073db6d4832707420237a00bad7125795e645e5bc3e1431ecbabf0ff5f74416626322545c966241cce6d8f2c035a78f100e030741f13b02a9eaf618d468bc40274db98bc342be12ad4d892c2ba546e571c556ac7cbf4e4c3fd3431efd40457cf65a297845dd8cce09811418c3cef941ff32c43c375157f6f49c2e893625e4b216b1f985aa0fd25f29a9011d4f59c78b037ed71f384e5de8116e3fc148c0a3cad07cb119b9829aac55eed9a299edb9abc5d017be485f690add70ff2efbb889ac6ce0da9b3bdbeb9dd47823116733d58a8d510b7f2e2c8244a2cbf53816b59e413207fb75f9c5ce1af06e67d182d3250ea3283bcbb45cb07ea6a6aa486361eb6f69199c0eb8e6490beff82e4ab274b1204e7f2f0ba097fba0332aa4c4a861771f5b3d45ce43e667581a40fee4bebe7fa9d87b70a5bb876c928f7e6d16ae604b3a4e9c7f1d616e2deab96b6207705b9a8f87468503cdd20a3c02cc8da43d046da68b5ed163d926a5a714a4df1b8ef007bca408f68b9e20de86d6398ad81df5e74d5aaac40874b5d6787211ff88e128cf1676e84ca7f51aee5951efee1915dcc11502a8df74fac4c8451dda49b631a8fb87470f0ebe9b67449bbd1640ceee6101e8cd82aa1033fa84f75b28450e461b93f65da5c43759b0e83660d50961702bb1ad015dad42e600117475237cf6e7279d4a02d1f67cf59de0108355d03963e3d84ce7647173dd7d77a6b3f275d7de74236d7bbb2df437d536136dbe1dbe8f307facc7bc7d0cde1abf745cbeb81af1ab2c46138cf007e901f22668377958bcbbadb7e9905973b27ff0c5baaece25e974c1bd116cc81dd1c81a30bae86a6fb12c6a5494068e122153128313eb3e628d76e9babc823c9eb9d3b81bacfa7a6b372abe6b1246a350f23e2e95b09c9037a75aac255ef7d4f267cad3ce869531b4165db2e5a9792094efea4ae3d9ea4d0efdc712e63df21882a353743190e016b2166e4da8a2c78e48defc7155d5fdfc4e596624e6a19c91b43719a22c1204b1cefe05989d455773d3881fa8d3eefc255f81dfe90bd41dc6f1e9c265a753298a6e98c999acd9525a9db5f9f9456a0f51a93dd9693e1d9c3fa283f7c58a9c752afcaa635abea8dfc80e2c326b939260069457fdad68c341852dcb5fcbbd351318defd7ae3b9f827478eb77306a5ae14cf8895f2bc6f0f361ffc8aa37e286629dc7e59b73a8712525e851c64d363065631edc1609f3d49a09575876a"
          );
  local_78._0_4_ = 0;
  local_78._4_4_ = 0;
  local_78._8_4_ = 0;
  local_78._12_4_ = 0;
  local_78._16_4_ = 0;
  uStack_64 = 0;
  CChain::SetTip((CChain *)local_78,(CBlockIndex *)((long)__s_00 + 0xe7ee68));
  iVar12 = 0;
  do {
    do {
      uVar8 = RandomMixin<FastRandomContext>::randbits
                        (&this_00->super_RandomMixin<FastRandomContext>,0x11);
    } while (99999 < uVar8);
    uVar3 = *(uint *)((long)__s_00 + uVar8 * 0x98 + 0x80);
    pCVar9 = CChain::FindEarliestAtLeast((CChain *)local_78,(ulong)uVar3,0);
    local_b8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_b0 = "";
    local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x8c;
    file_00.m_begin = (iterator)&local_b8;
    msg_00.m_end = in_R9;
    msg_00.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_c8,
               msg_00);
    local_e0.m_message.px = (element_type *)0x0;
    local_e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_f0 = "ret->nTimeMax >= test_time";
    local_e8 = "";
    local_58[8] = false;
    local_58._0_8_ = &PTR__lazy_ostream_013ae1c8;
    local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
    ppcStack_40 = &local_f0;
    local_100 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_f8 = "";
    pvVar14 = (iterator)0x1;
    pvVar15 = (iterator)0x0;
    local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(uVar3 <= pCVar9->nTimeMax);
    boost::test_tools::tt_detail::report_assertion
              (&local_e0,(lazy_ostream *)local_58,1,0,WARN,_cVar19,(size_t)&local_100,0x8c);
    boost::detail::shared_count::~shared_count(&local_e0.m_message.pn);
    local_110 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_108 = "";
    local_120 = &boost::unit_test::basic_cstring<char_const>::null;
    local_118 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x8d;
    file_01.m_begin = (iterator)&local_110;
    msg_01.m_end = pvVar15;
    msg_01.m_begin = pvVar14;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_120,
               msg_01);
    if (pCVar9->pprev == (CBlockIndex *)0x0) {
      local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x1;
    }
    else {
      local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(pCVar9->pprev->nTimeMax < uVar3);
    }
    local_e0.m_message.px = (element_type *)0x0;
    local_e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_f0 = "(ret->pprev==nullptr) || ret->pprev->nTimeMax < test_time";
    local_e8 = "";
    local_58[8] = false;
    local_58._0_8_ = &PTR__lazy_ostream_013ae1c8;
    local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
    ppcStack_40 = &local_f0;
    local_130 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_128 = "";
    pvVar14 = (iterator)0x1;
    pvVar15 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_e0,(lazy_ostream *)local_58,1,0,WARN,_cVar19,(size_t)&local_130,0x8d);
    boost::detail::shared_count::~shared_count(&local_e0.m_message.pn);
    local_140 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_138 = "";
    local_150 = &boost::unit_test::basic_cstring<char_const>::null;
    local_148 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x8e;
    file_02.m_begin = (iterator)&local_140;
    msg_02.m_end = pvVar15;
    msg_02.m_begin = pvVar14;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_150,
               msg_02);
    pCVar10 = CBlockIndex::GetAncestor((CBlockIndex *)(uVar8 * 0x98 + (long)__s_00),pCVar9->nHeight)
    ;
    local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(pCVar10 == pCVar9);
    local_e0.m_message.px = (element_type *)0x0;
    local_e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_f0 = "vBlocksMain[r].GetAncestor(ret->nHeight) == ret";
    local_e8 = "";
    local_58[8] = false;
    local_58._0_8_ = &PTR__lazy_ostream_013ae1c8;
    local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
    ppcStack_40 = &local_f0;
    local_160 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_158 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_e0,(lazy_ostream *)local_58,1,0,WARN,_cVar19,(size_t)&local_160,0x8e);
    boost::detail::shared_count::~shared_count(&local_e0.m_message.pn);
    iVar12 = iVar12 + 1;
  } while (iVar12 != 10000);
  pvVar11 = (void *)CONCAT44(local_78._4_4_,local_78._0_4_);
  if (pvVar11 != (void *)0x0) {
    operator_delete(pvVar11,CONCAT44(uStack_64,local_78._16_4_) - (long)pvVar11);
  }
  operator_delete(__s_00,15200000);
  operator_delete(__s,3200000);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(findearliestatleast_test)
{
    std::vector<uint256> vHashMain(100000);
    std::vector<CBlockIndex> vBlocksMain(100000);
    for (unsigned int i=0; i<vBlocksMain.size(); i++) {
        vHashMain[i] = ArithToUint256(i); // Set the hash equal to the height
        vBlocksMain[i].nHeight = i;
        vBlocksMain[i].pprev = i ? &vBlocksMain[i - 1] : nullptr;
        vBlocksMain[i].phashBlock = &vHashMain[i];
        vBlocksMain[i].BuildSkip();
        if (i < 10) {
            vBlocksMain[i].nTime = i;
            vBlocksMain[i].nTimeMax = i;
        } else {
            // randomly choose something in the range [MTP, MTP*2]
            int64_t medianTimePast = vBlocksMain[i].GetMedianTimePast();
            int r{int(m_rng.randrange(medianTimePast))};
            vBlocksMain[i].nTime = uint32_t(r + medianTimePast);
            vBlocksMain[i].nTimeMax = std::max(vBlocksMain[i].nTime, vBlocksMain[i-1].nTimeMax);
        }
    }
    // Check that we set nTimeMax up correctly.
    unsigned int curTimeMax = 0;
    for (unsigned int i=0; i<vBlocksMain.size(); ++i) {
        curTimeMax = std::max(curTimeMax, vBlocksMain[i].nTime);
        BOOST_CHECK(curTimeMax == vBlocksMain[i].nTimeMax);
    }

    // Build a CChain for the main branch.
    CChain chain;
    chain.SetTip(vBlocksMain.back());

    // Verify that FindEarliestAtLeast is correct.
    for (unsigned int i=0; i<10000; ++i) {
        // Pick a random element in vBlocksMain.
        int r = m_rng.randrange(vBlocksMain.size());
        int64_t test_time = vBlocksMain[r].nTime;
        CBlockIndex* ret = chain.FindEarliestAtLeast(test_time, 0);
        BOOST_CHECK(ret->nTimeMax >= test_time);
        BOOST_CHECK((ret->pprev==nullptr) || ret->pprev->nTimeMax < test_time);
        BOOST_CHECK(vBlocksMain[r].GetAncestor(ret->nHeight) == ret);
    }
}